

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhosgPNGConv.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *filename;
  char *filename_00;
  Image img;
  Image local_60;
  Image local_38;
  
  if (argc < 2) {
    phosg::Image::Image(&local_38);
    filename_00 = (char *)0x0;
  }
  else {
    filename = argv[1];
    if (argc == 2) {
      filename_00 = (char *)0x0;
    }
    else {
      if (3 < (uint)argc) {
        main_cold_1();
        return 1;
      }
      filename_00 = argv[2];
    }
    phosg::Image::Image(&local_38);
    if ((filename != (char *)0x0) && ((*filename != '-' || (filename[1] != '\0')))) {
      phosg::Image::Image(&local_60,filename);
      phosg::Image::operator=(&local_38,&local_60);
      goto LAB_00105cfd;
    }
  }
  phosg::Image::Image(&local_60,_stdin);
  phosg::Image::operator=(&local_38,&local_60);
LAB_00105cfd:
  phosg::Image::~Image(&local_60);
  if ((filename_00 == (char *)0x0) || ((*filename_00 == '-' && (filename_00[1] == '\0')))) {
    phosg::Image::save(&local_38,_stdout,PNG);
  }
  else {
    phosg::Image::save(&local_38,filename_00,PNG);
  }
  phosg::Image::~Image(&local_38);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  const char* src_filename = (argc > 1) ? argv[1] : nullptr;
  const char* dst_filename = (argc > 2) ? argv[2] : nullptr;
  if (argc > 3) {
    fprintf(stderr, "too many positional arguments given\n");
    return 1;
  }

  Image img;
  if (!src_filename || !strcmp(src_filename, "-")) {
    img = Image(stdin);
  } else {
    img = Image(src_filename);
  }

  if (!dst_filename || !strcmp(dst_filename, "-")) {
    img.save(stdout, Image::Format::PNG);
  } else {
    img.save(dst_filename, Image::Format::PNG);
  }

  return 0;
}